

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_piece_util.cc
# Opt level: O1

bool EqualsCaseInsensitiveASCII(StringPiece a,StringPiece b)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  char cVar6;
  bool bVar7;
  
  uVar4 = a.len_;
  if (uVar4 != b.len_) {
    return false;
  }
  bVar7 = uVar4 == 0;
  if (!bVar7) {
    cVar1 = *a.str_;
    cVar5 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar5 = cVar1;
    }
    cVar1 = *b.str_;
    cVar6 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar6 = cVar1;
    }
    if (cVar5 == cVar6) {
      uVar2 = 1;
      do {
        uVar3 = uVar2;
        if (uVar4 == uVar3) break;
        cVar1 = a.str_[uVar3];
        cVar5 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar5 = cVar1;
        }
        cVar1 = b.str_[uVar3];
        cVar6 = cVar1 + ' ';
        if (0x19 < (byte)(cVar1 + 0xbfU)) {
          cVar6 = cVar1;
        }
        uVar2 = uVar3 + 1;
      } while (cVar5 == cVar6);
      bVar7 = uVar4 <= uVar3;
    }
  }
  return bVar7;
}

Assistant:

bool EqualsCaseInsensitiveASCII(StringPiece a, StringPiece b) {
  if (a.len_ != b.len_) {
    return false;
  }

  for (size_t i = 0; i < a.len_; ++i) {
    if (ToLowerASCII(a.str_[i]) != ToLowerASCII(b.str_[i])) {
      return false;
    }
  }

  return true;
}